

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O3

char * ssh_sftp_get_cmdline(char *prompt,_Bool no_fds_ok)

{
  char *ptr;
  ssize_t sVar1;
  size_t oldlen;
  size_t bufsize;
  undefined1 local_40;
  undefined1 local_3f;
  int local_3c;
  size_t local_38;
  
  fputs(prompt,_stdout);
  fflush(_stdout);
  local_38 = 0;
  local_40 = 1;
  local_3c = 0;
  local_3f = no_fds_ok;
  cli_main_loop(ssh_sftp_pw_setup,ssh_sftp_pw_check,ssh_sftp_mainloop_continue,&local_40);
  if (local_3c < 0) {
    ptr = (char *)0x0;
  }
  else {
    oldlen = 0;
    ptr = (char *)0x0;
    do {
      if (local_3c != 0) {
        ptr = (char *)safegrowarray(ptr,&local_38,1,oldlen,1,false);
        sVar1 = read(0,ptr + oldlen,1);
        if ((int)sVar1 < 0) {
          perror("read");
          goto LAB_00114d95;
        }
        if ((int)sVar1 == 0) goto LAB_00114d95;
        if (ptr[oldlen] == '\n') {
          return ptr;
        }
        oldlen = oldlen + 1;
      }
      local_40 = 1;
      local_3c = 0;
      local_3f = no_fds_ok;
      cli_main_loop(ssh_sftp_pw_setup,ssh_sftp_pw_check,ssh_sftp_mainloop_continue,&local_40);
    } while (-1 < local_3c);
  }
  puts("connection died");
LAB_00114d95:
  safefree(ptr);
  return (char *)0x0;
}

Assistant:

char *ssh_sftp_get_cmdline(const char *prompt, bool no_fds_ok)
{
    char *buf;
    size_t buflen, bufsize;
    int ret;

    fputs(prompt, stdout);
    fflush(stdout);

    buf = NULL;
    buflen = bufsize = 0;

    while (1) {
        ret = ssh_sftp_do_select(true, no_fds_ok);
        if (ret < 0) {
            printf("connection died\n");
            sfree(buf);
            return NULL;               /* woop woop */
        }
        if (ret > 0) {
            sgrowarray(buf, bufsize, buflen);
            ret = read(0, buf+buflen, 1);
            if (ret < 0) {
                perror("read");
                sfree(buf);
                return NULL;
            }
            if (ret == 0) {
                /* eof on stdin; no error, but no answer either */
                sfree(buf);
                return NULL;
            }

            if (buf[buflen++] == '\n') {
                /* we have a full line */
                return buf;
            }
        }
    }
}